

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniSSC.cpp
# Opt level: O1

void * MiniSSCThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  double dVar16;
  int selectedchannels [5];
  int pws [5];
  CHRONO chrono_period;
  char szTemp [256];
  MINISSC minissc;
  char szSaveFilePath [256];
  timespec local_8e8;
  undefined4 local_8d8;
  int local_8c8 [6];
  double local_8b0;
  timespec local_8a8;
  long local_898;
  long lStack_890;
  long local_888;
  long lStack_880;
  timespec local_878;
  int local_868;
  double local_860;
  char local_858 [264];
  MINISSC local_750;
  char local_138 [264];
  
  memset(&local_750,0,0x618);
  iVar3 = clock_getres(4,&local_878);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_8a8), iVar3 == 0)) {
    local_868 = 0;
    local_898 = 0;
    lStack_890 = 0;
    local_888 = 0;
    lStack_880 = 0;
  }
  iVar3 = 0x32;
  bVar1 = false;
  local_8c8[5] = 0;
  do {
    local_8b0 = (double)CONCAT44(local_8b0._4_4_,iVar3);
    while( true ) {
      if (local_868 == 0) {
        clock_gettime(4,&local_8e8);
        local_898 = local_8e8.tv_sec;
        lStack_890 = local_8e8.tv_nsec;
        local_8e8.tv_sec =
             (local_8e8.tv_sec + local_888 + (local_8e8.tv_nsec + lStack_880) / 1000000000) -
             local_8a8.tv_sec;
        local_8e8.tv_nsec = (local_8e8.tv_nsec + lStack_880) % 1000000000 - local_8a8.tv_nsec;
        if (local_8e8.tv_nsec < 0) {
          local_8e8.tv_sec = local_8e8.tv_sec + local_8e8.tv_nsec / 1000000000 + -1;
          local_8e8.tv_nsec = local_8e8.tv_nsec % 1000000000 + 1000000000;
        }
        local_888 = local_8e8.tv_sec;
        lStack_880 = local_8e8.tv_nsec;
      }
      iVar4 = clock_getres(4,&local_878);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_8a8), iVar4 == 0)) {
        local_868 = 0;
        local_888 = 0;
        lStack_880 = 0;
        local_898 = 0;
        lStack_890 = 0;
      }
      local_8e8.tv_sec = (long)iVar3 / 1000;
      local_8e8.tv_nsec = ((long)iVar3 % 1000) * 1000000;
      nanosleep(&local_8e8,(timespec *)0x0);
      if (bPauseMiniSSC == 0) break;
      if (bVar1) {
        puts("MiniSSC paused.");
        iVar4 = CloseRS232Port(&local_750.RS232Port);
        pcVar15 = "MiniSSC disconnection failed.";
        if (iVar4 == 0) {
          pcVar15 = "MiniSSC disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_001c069c;
      }
      local_8e8.tv_sec = 0;
      local_8e8.tv_nsec = 100000000;
      bVar1 = false;
      nanosleep(&local_8e8,(timespec *)0x0);
    }
    iVar4 = local_8b0._0_4_;
    if (bRestartMiniSSC != 0) {
      if (bVar1) {
        puts("Restarting a MiniSSC.");
        iVar3 = CloseRS232Port(&local_750.RS232Port);
        pcVar15 = "MiniSSC disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "MiniSSC disconnected.";
        }
        puts(pcVar15);
      }
      bRestartMiniSSC = 0;
      bVar1 = false;
    }
    if (bVar1) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      local_860 = u1 * 1000.0;
      local_8b0 = u2 * 1000.0;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      local_8e8.tv_sec = 0;
      local_8e8.tv_nsec = 0;
      bVar2 = false;
      local_8c8[0] = 0;
      local_8c8[1] = 0;
      local_8c8[2] = 0;
      local_8c8[3] = 0;
      local_8c8[4] = 0;
      lVar14 = (long)local_750.rightthrusterchan;
      dVar16 = local_8b0 * 0.5;
      local_8c8[lVar14] = (int)(local_860 * 0.5) + 0x5dc;
      lVar8 = (long)local_750.leftthrusterchan;
      local_8c8[lVar8] = (int)dVar16 + 0x5dc;
      iVar3 = local_8c8[lVar14];
      if (1999 < iVar3) {
        iVar3 = 2000;
      }
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      local_8c8[lVar14] = iVar3;
      iVar3 = local_8c8[lVar8];
      if (1999 < local_8c8[lVar8]) {
        iVar3 = 2000;
      }
      local_8d8 = 0;
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      local_8c8[lVar8] = iVar3;
      bVar1 = true;
      *(undefined4 *)((long)&local_8e8.tv_sec + lVar14 * 4) = 1;
      *(undefined4 *)((long)&local_8e8.tv_sec + lVar8 * 4) = 1;
      iVar5 = SetAllPWMsMiniSSC(&local_750,(int *)&local_8e8,local_8c8);
      iVar3 = iVar4;
      if (iVar5 != 0) {
        puts("Connection to a MiniSSC lost.");
        iVar3 = CloseRS232Port(&local_750.RS232Port);
        if (iVar3 == 0) {
          pcVar15 = "MiniSSC disconnected.";
        }
        else {
          pcVar15 = "MiniSSC disconnection failed.";
        }
        puts(pcVar15);
LAB_001c04d3:
        bVar1 = false;
        bVar2 = true;
        iVar3 = iVar4;
      }
    }
    else {
      iVar5 = ConnectMiniSSC(&local_750,"MiniSSC0.txt");
      iVar3 = local_750.threadperiod;
      if (iVar5 != 0) {
        local_8e8.tv_sec = 1;
        local_8e8.tv_nsec = 0;
        nanosleep(&local_8e8,(timespec *)0x0);
        goto LAB_001c04d3;
      }
      if ((FILE *)local_750.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_750.pfSaveFile);
        local_750.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_750.bSaveRawData != 0) && ((FILE *)local_750.pfSaveFile == (FILE *)0x0)) {
        if (local_750.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_858,"minissc",8);
        }
        else {
          sprintf(local_858,"%.127s",local_750.szCfgFilePath);
        }
        sVar7 = strlen(local_858);
        uVar6 = (uint)sVar7;
        uVar13 = sVar7 & 0xffffffff;
        uVar9 = (int)uVar6 >> 0x1f & uVar6;
        uVar12 = sVar7 & 0xffffffff;
        do {
          uVar13 = uVar13 - 1;
          uVar11 = (uint)uVar12;
          uVar12 = (ulong)(uVar9 - 1);
          uVar10 = uVar9;
          if ((int)uVar11 < 1) break;
          uVar12 = (ulong)(uVar11 - 1);
          uVar10 = uVar11;
        } while (local_858[uVar13 & 0xffffffff] != '.');
        if ((int)uVar10 <= (int)uVar6 && 1 < (int)uVar10) {
          memset(local_858 + uVar12,0,sVar7 - uVar12);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar15 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",local_858,pcVar15);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        bVar2 = false;
        local_750.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_750.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create MiniSSC data file.");
          bVar2 = false;
          goto LAB_001c069c;
        }
      }
    }
    if ((bVar2) &&
       (local_8c8[5] = local_8c8[5] + 1, ExitOnErrorCount <= local_8c8[5] && 0 < ExitOnErrorCount))
    {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001c069c:
      local_8e8.tv_sec = 0;
      local_8e8.tv_nsec = 0;
      local_8c8[0] = 0;
      local_8c8[1] = 0;
      local_8c8[2] = 0;
      local_8c8[3] = 0;
      local_8c8[4] = 0;
      lVar8 = (long)local_750.rightthrusterchan;
      local_8c8[lVar8] = 0x5dc;
      lVar14 = (long)local_750.leftthrusterchan;
      local_8c8[lVar14] = 0x5dc;
      iVar3 = local_8c8[lVar8];
      if (1999 < iVar3) {
        iVar3 = 2000;
      }
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      local_8c8[lVar8] = iVar3;
      iVar3 = 2000;
      if (local_8c8[lVar14] < 2000) {
        iVar3 = local_8c8[lVar14];
      }
      local_8d8 = 0;
      if (iVar3 < 0x3e9) {
        iVar3 = 1000;
      }
      local_8c8[lVar14] = iVar3;
      *(undefined4 *)((long)&local_8e8.tv_sec + lVar8 * 4) = 1;
      *(undefined4 *)((long)&local_8e8.tv_sec + lVar14 * 4) = 1;
      SetAllPWMsMiniSSC(&local_750,(int *)&local_8e8,local_8c8);
      local_8e8.tv_sec = 0;
      local_8e8.tv_nsec = 50000000;
      nanosleep(&local_8e8,(timespec *)0x0);
      if (local_868 == 0) {
        clock_gettime(4,&local_8e8);
        local_898 = local_8e8.tv_sec;
        lStack_890 = local_8e8.tv_nsec;
        local_8e8.tv_sec =
             (local_8e8.tv_sec + local_888 + (local_8e8.tv_nsec + lStack_880) / 1000000000) -
             local_8a8.tv_sec;
        local_8e8.tv_nsec = (local_8e8.tv_nsec + lStack_880) % 1000000000 - local_8a8.tv_nsec;
        if (local_8e8.tv_nsec < 0) {
          local_8e8.tv_sec = local_8e8.tv_sec + local_8e8.tv_nsec / 1000000000 + -1;
          local_8e8.tv_nsec = local_8e8.tv_nsec % 1000000000 + 1000000000;
        }
        local_888 = local_8e8.tv_sec;
        lStack_880 = local_8e8.tv_nsec;
      }
      if ((FILE *)local_750.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_750.pfSaveFile);
        local_750.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        iVar3 = CloseRS232Port(&local_750.RS232Port);
        pcVar15 = "MiniSSC disconnection failed.";
        if (iVar3 == 0) {
          pcVar15 = "MiniSSC disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MiniSSCThread(void* pParam)
{
	MINISSC minissc;
	//double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&minissc, 0, sizeof(MINISSC));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMiniSSC) 
		{
			if (bConnected)
			{
				printf("MiniSSC paused.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMiniSSC) 
		{
			if (bConnected)
			{
				printf("Restarting a MiniSSC.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			bRestartMiniSSC = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMiniSSC(&minissc, "MiniSSC0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = minissc.threadperiod;

				if (minissc.pfSaveFile != NULL)
				{
					fclose(minissc.pfSaveFile); 
					minissc.pfSaveFile = NULL;
				}
				if ((minissc.bSaveRawData)&&(minissc.pfSaveFile == NULL)) 
				{
					if (strlen(minissc.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", minissc.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "minissc");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					minissc.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (minissc.pfSaveFile == NULL) 
					{
						printf("Unable to create MiniSSC data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUBBLE_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersMiniSSC(&minissc, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a MiniSSC lost.\n");
					bConnected = FALSE;
					DisconnectMiniSSC(&minissc);
					break;
				}
				break;
			}
		}

		//printf("MiniSSCThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	default:
		SetThrustersMiniSSC(&minissc, 0, 0);
		mSleep(50);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (minissc.pfSaveFile != NULL)
	{
		fclose(minissc.pfSaveFile); 
		minissc.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMiniSSC(&minissc);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}